

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# userauth.c
# Opt level: O0

int memory_read_privatekey
              (LIBSSH2_SESSION *session,LIBSSH2_HOSTKEY_METHOD **hostkey_method,
              void **hostkey_abstract,uchar *method,size_t method_len,char *privkeyfiledata,
              size_t privkeyfiledata_len,char *passphrase)

{
  int iVar1;
  bool bVar2;
  LIBSSH2_HOSTKEY_METHOD **local_48;
  LIBSSH2_HOSTKEY_METHOD **hostkey_methods_avail;
  char *privkeyfiledata_local;
  size_t method_len_local;
  uchar *method_local;
  void **hostkey_abstract_local;
  LIBSSH2_HOSTKEY_METHOD **hostkey_method_local;
  LIBSSH2_SESSION *session_local;
  
  local_48 = libssh2_hostkey_methods();
  *hostkey_method = (LIBSSH2_HOSTKEY_METHOD *)0x0;
  *hostkey_abstract = (void *)0x0;
  while( true ) {
    bVar2 = false;
    if (*local_48 != (LIBSSH2_HOSTKEY_METHOD *)0x0) {
      bVar2 = (*local_48)->name != (char *)0x0;
    }
    if (!bVar2) goto LAB_00143518;
    if (((*local_48)->initPEMFromMemory !=
         (_func_int_LIBSSH2_SESSION_ptr_char_ptr_size_t_uchar_ptr_void_ptr_ptr *)0x0) &&
       (iVar1 = strncmp((*local_48)->name,(char *)method,method_len), iVar1 == 0)) break;
    local_48 = local_48 + 1;
  }
  *hostkey_method = *local_48;
LAB_00143518:
  if (*hostkey_method == (LIBSSH2_HOSTKEY_METHOD *)0x0) {
    session_local._4_4_ = _libssh2_error(session,-0x11,"No handler for specified private key");
  }
  else {
    iVar1 = (*(*hostkey_method)->initPEMFromMemory)
                      (session,privkeyfiledata,privkeyfiledata_len,(uchar *)passphrase,
                       hostkey_abstract);
    if (iVar1 == 0) {
      session_local._4_4_ = 0;
    }
    else {
      session_local._4_4_ =
           _libssh2_error(session,-0x10,"Unable to initialize private key from memory");
    }
  }
  return session_local._4_4_;
}

Assistant:

static int
memory_read_privatekey(LIBSSH2_SESSION * session,
                       const LIBSSH2_HOSTKEY_METHOD ** hostkey_method,
                       void **hostkey_abstract,
                       const unsigned char *method, size_t method_len,
                       const char *privkeyfiledata, size_t privkeyfiledata_len,
                       const char *passphrase)
{
    const LIBSSH2_HOSTKEY_METHOD **hostkey_methods_avail =
        libssh2_hostkey_methods();

    *hostkey_method = NULL;
    *hostkey_abstract = NULL;
    while(*hostkey_methods_avail && (*hostkey_methods_avail)->name) {
        if((*hostkey_methods_avail)->initPEMFromMemory
             && strncmp((*hostkey_methods_avail)->name, (const char *) method,
                        method_len) == 0) {
            *hostkey_method = *hostkey_methods_avail;
            break;
        }
        hostkey_methods_avail++;
    }
    if(!*hostkey_method) {
        return _libssh2_error(session, LIBSSH2_ERROR_METHOD_NONE,
                              "No handler for specified private key");
    }

    if((*hostkey_method)->
        initPEMFromMemory(session, privkeyfiledata, privkeyfiledata_len,
                          (unsigned char *) passphrase,
                          hostkey_abstract)) {
        return _libssh2_error(session, LIBSSH2_ERROR_FILE,
                              "Unable to initialize private key from memory");
    }

    return 0;
}